

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O3

Constant * __thiscall flow::lang::IRGenerator::getConstant(IRGenerator *this,Expr *expr)

{
  IRProgram *pIVar1;
  Report *this_00;
  LiteralType args;
  long lVar2;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *pCVar3;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *pCVar4;
  string local_38;
  
  if (expr != (Expr *)0x0) {
    lVar2 = __dynamic_cast(expr,&Expr::typeinfo,&LiteralExpr<std::__cxx11::string>::typeinfo,0);
    if (lVar2 != 0) {
      pIVar1 = (this->super_IRBuilder).program_;
      pCVar3 = IRProgram::
               get<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::__cxx11::string>
                         (pIVar1,&pIVar1->strings_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (lVar2 + 0x40));
      return &pCVar3->super_Constant;
    }
    lVar2 = __dynamic_cast(expr,&Expr::typeinfo,&LiteralExpr<flow::util::RegExp>::typeinfo,0);
    if (lVar2 != 0) {
      pIVar1 = (this->super_IRBuilder).program_;
      pCVar4 = IRProgram::
               get<flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>,flow::util::RegExp>
                         (pIVar1,&pIVar1->regexps_,(RegExp *)(lVar2 + 0x40));
      return &pCVar4->super_Constant;
    }
  }
  this_00 = this->report_;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"FIXME: Invalid (unsupported) literal type <{}> in match case.","")
  ;
  args = (*(expr->super_ASTNode)._vptr_ASTNode[3])(expr);
  diagnostics::Report::typeError<flow::LiteralType>
            (this_00,&(expr->super_ASTNode).location_,&local_38,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (Constant *)0x0;
}

Assistant:

Constant* IRGenerator::getConstant(Expr* expr) {
  if (auto e = dynamic_cast<StringExpr*>(expr))
    return get(e->value());
  else if (auto e = dynamic_cast<RegExpExpr*>(expr))
    return get(e->value());
  else {
    report_->typeError(expr->location(),
                       "FIXME: Invalid (unsupported) literal type <{}> in match case.",
                       expr->getType());
    return nullptr;
  }
}